

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void PlayerLandedOnThing(AActor *mo,AActor *onmobj)

{
  AActor *pAVar1;
  bool bVar2;
  int iVar3;
  FTerrainDef *pFVar4;
  FSoundID local_24;
  FSoundID local_20;
  byte local_19;
  AActor *pAStack_18;
  bool grunted;
  AActor *onmobj_local;
  AActor *mo_local;
  
  if (mo->player != (player_t *)0x0) {
    if (mo->player->mo == (APlayerPawn *)mo) {
      mo->player->deltaviewheight = (mo->Vel).Z / 8.0;
    }
    if ((((mo->player->cheats & 0x2000U) == 0) &&
        (pAStack_18 = onmobj, onmobj_local = mo, P_FallingDamage(mo), pAVar1 = onmobj_local,
        onmobj_local->player->morphTics == 0)) && (0 < onmobj_local->health)) {
      local_19 = 0;
      if ((0 < onmobj_local->health) &&
         ((onmobj_local->Vel).Z < -onmobj_local->player->mo->GruntSpeed)) {
        FSoundID::FSoundID(&local_20,"*grunt");
        S_Sound(pAVar1,2,&local_20,1.0,1.0);
        local_19 = 1;
      }
      if (pAStack_18 == (AActor *)0x0) {
        iVar3 = P_GetThingFloorType(onmobj_local);
        pFVar4 = TArray<FTerrainDef,_FTerrainDef>::operator[](&Terrains,(long)iVar3);
        if ((pFVar4->IsLiquid & 1U) != 0) {
          return;
        }
      }
      if (((local_19 & 1) == 0) ||
         (bVar2 = S_AreSoundsEquivalent(onmobj_local,"*grunt","*land"), !bVar2)) {
        pAVar1 = onmobj_local;
        FSoundID::FSoundID(&local_24,"*land");
        S_Sound(pAVar1,0,&local_24,1.0,1.0);
      }
    }
  }
  return;
}

Assistant:

static void PlayerLandedOnThing (AActor *mo, AActor *onmobj)
{
	bool grunted;

	if (!mo->player)
		return;

	if (mo->player->mo == mo)
	{
		mo->player->deltaviewheight = mo->Vel.Z / 8.;
	}

	if (mo->player->cheats & CF_PREDICTING)
		return;

	P_FallingDamage (mo);

	// [RH] only make noise if alive
	if (!mo->player->morphTics && mo->health > 0)
	{
		grunted = false;
		// Why should this number vary by gravity?
		if (mo->health > 0 && mo->Vel.Z < -mo->player->mo->GruntSpeed)
		{
			S_Sound (mo, CHAN_VOICE, "*grunt", 1, ATTN_NORM);
			grunted = true;
		}
		if (onmobj != NULL || !Terrains[P_GetThingFloorType (mo)].IsLiquid)
		{
			if (!grunted || !S_AreSoundsEquivalent (mo, "*grunt", "*land"))
			{
				S_Sound (mo, CHAN_AUTO, "*land", 1, ATTN_NORM);
			}
		}
	}
//	mo->player->centering = true;
}